

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtocsv.cpp
# Opt level: O3

void help(void)

{
  fwrite("-r Convert binary OASIS_FLOAT input to csv\n",0x2b,1,_stderr);
  fwrite("-v version\n",0xb,1,_stderr);
  fwrite("-s skip header\n",0xf,1,_stderr);
  fwrite("-g generate random numbers\n",0x1b,1,_stderr);
  fwrite("-S seed value\n",0xe,1,_stderr);
  fwrite("-h help\n",8,1,_stderr);
  return;
}

Assistant:

void help()
{
	fprintf(stderr, "-r Convert binary OASIS_FLOAT input to csv\n");
	fprintf(stderr, "-v version\n");
	fprintf(stderr, "-s skip header\n");
	fprintf(stderr, "-g generate random numbers\n");
	fprintf(stderr, "-S seed value\n");	
	fprintf(stderr, "-h help\n");
}